

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

User * __thiscall Database::getUserById(User *__return_storage_ptr__,Database *this,int id)

{
  sqlite3 *db;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  DatabaseException *pDVar4;
  ostream *this_00;
  allocator local_111;
  string local_110 [39];
  undefined1 local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [8];
  string error;
  int failure;
  __cxx11 local_90 [32];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [8];
  string query;
  char *local_28;
  char *errorMsg;
  Database *pDStack_18;
  int id_local;
  Database *this_local;
  User *result;
  
  local_28 = (char *)0x0;
  errorMsg._4_4_ = id;
  pDStack_18 = this;
  this_local = (Database *)__return_storage_ptr__;
  User::User(__return_storage_ptr__);
  std::__cxx11::to_string(local_90,errorMsg._4_4_);
  std::operator+((char *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "select * from users where id = ");
  std::operator+(local_50,(char *)local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_90);
  db = this->database;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = sqlite3_exec(db,pcVar3,make_user_callback,__return_storage_ptr__,&local_28);
  pcVar3 = local_28;
  if (iVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,pcVar3,&local_c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    sqlite3_free(local_28);
    local_e9 = 1;
    pDVar4 = (DatabaseException *)__cxa_allocate_exception(0x28);
    std::operator+((char *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Error while getting user by id: ");
    DatabaseException::DatabaseException(pDVar4,local_e8);
    local_e9 = 0;
    __cxa_throw(pDVar4,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  bVar1 = User::isEmpty(__return_storage_ptr__);
  if (bVar1) {
    pDVar4 = (DatabaseException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"User not found",&local_111);
    DatabaseException::DatabaseException(pDVar4,(string *)local_110);
    __cxa_throw(pDVar4,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  this_00 = std::operator<<((ostream *)&std::cout,"User got successfully");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

User Database::getUserById(int id)
{
	char* errorMsg = nullptr;
	User result;
	std::string query = "select * from users where id = " + std::to_string(id) + ";";

	int failure = sqlite3_exec(database, query.c_str(), make_user_callback, &result, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting user by id: " + error);
	}
	else if(result.isEmpty())
	{
		throw DatabaseException("User not found");
	}
	else
	{
		std::cout << "User got successfully" << std::endl;
		return result;
	}
}